

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

SimpleAssignmentPatternExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,bool_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>&,slang::SourceRange&>
          (BumpAllocator *this,Type *args,bool *args_1,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args_2,
          SourceRange *args_3)

{
  bool bVar1;
  pointer ppEVar2;
  size_t sVar3;
  SourceLocation SVar4;
  SourceLocation SVar5;
  SimpleAssignmentPatternExpression *pSVar6;
  
  pSVar6 = (SimpleAssignmentPatternExpression *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SimpleAssignmentPatternExpression *)this->endPtr < pSVar6 + 1) {
    pSVar6 = (SimpleAssignmentPatternExpression *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(pSVar6 + 1);
  }
  bVar1 = *args_1;
  ppEVar2 = args_2->_M_ptr;
  sVar3 = (args_2->_M_extent)._M_extent_value;
  SVar4 = args_3->startLoc;
  SVar5 = args_3->endLoc;
  (pSVar6->super_AssignmentPatternExpressionBase).super_Expression.kind = SimpleAssignmentPattern;
  (pSVar6->super_AssignmentPatternExpressionBase).super_Expression.type.ptr = args;
  (pSVar6->super_AssignmentPatternExpressionBase).super_Expression.constant = (ConstantValue *)0x0;
  (pSVar6->super_AssignmentPatternExpressionBase).super_Expression.syntax = (ExpressionSyntax *)0x0;
  (pSVar6->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc = SVar4;
  (pSVar6->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc = SVar5;
  (pSVar6->super_AssignmentPatternExpressionBase).elements_._M_ptr = ppEVar2;
  (pSVar6->super_AssignmentPatternExpressionBase).elements_._M_extent._M_extent_value = sVar3;
  pSVar6->isLValue = bVar1;
  return pSVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }